

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_remove(REF_AGENTS ref_agents,REF_INT id)

{
  REF_INT id_local;
  REF_AGENTS ref_agents_local;
  
  if ((id < 0) || (ref_agents->max <= id)) {
    ref_agents_local._4_4_ = 3;
  }
  else if (ref_agents->agent[id].mode == REF_AGENT_UNUSED) {
    ref_agents_local._4_4_ = 3;
  }
  else {
    if (ref_agents->last == id) {
      ref_agents->last = ref_agents->agent[id].previous;
    }
    if (ref_agents->agent[id].previous != -1) {
      ref_agents->agent[ref_agents->agent[id].previous].next = ref_agents->agent[id].next;
    }
    if (ref_agents->agent[id].next != -1) {
      ref_agents->agent[ref_agents->agent[id].next].previous = ref_agents->agent[id].previous;
    }
    ref_agents->agent[id].mode = REF_AGENT_UNUSED;
    ref_agents->agent[id].previous = -1;
    ref_agents->agent[id].next = ref_agents->blank;
    ref_agents->blank = id;
    ref_agents->n = ref_agents->n + -1;
    ref_agents_local._4_4_ = 0;
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_remove(REF_AGENTS ref_agents, REF_INT id) {
  if (id < 0 || ref_agents_max(ref_agents) <= id) return REF_INVALID;
  if (!ref_agent_valid(ref_agents, id)) return REF_INVALID;

  if (ref_agents->last == id)
    ref_agents->last = ref_agent_previous(ref_agents, id);

  if (REF_EMPTY != ref_agent_previous(ref_agents, id))
    ref_agent_next(ref_agents, ref_agent_previous(ref_agents, id)) =
        ref_agent_next(ref_agents, id);

  if (REF_EMPTY != ref_agent_next(ref_agents, id))
    ref_agent_previous(ref_agents, ref_agent_next(ref_agents, id)) =
        ref_agent_previous(ref_agents, id);

  ref_agent_mode(ref_agents, id) = REF_AGENT_UNUSED;
  ref_agent_previous(ref_agents, id) = REF_EMPTY;
  ref_agent_next(ref_agents, id) = ref_agents->blank;
  ref_agents->blank = id;

  ref_agents_n(ref_agents)--;

  return REF_SUCCESS;
}